

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O0

int stbir__resize_arbitrary
              (void *alloc_context,void *input_data,int input_w,int input_h,
              int input_stride_in_bytes,void *output_data,int output_w,int output_h,
              int output_stride_in_bytes,float s0,float t0,float s1,float t1,float *transform,
              int channels,int alpha_channel,stbir_uint32 flags,stbir_datatype type,
              stbir_filter h_filter,stbir_filter v_filter,stbir_edge edge_horizontal,
              stbir_edge edge_vertical,stbir_colorspace colorspace)

{
  stbir_uint32 sVar1;
  void *tempmem;
  void *extra_memory;
  size_t memory_required;
  undefined1 local_178 [4];
  int result;
  stbir__info info;
  float t1_local;
  float s1_local;
  float t0_local;
  float s0_local;
  void *output_data_local;
  int input_stride_in_bytes_local;
  int input_h_local;
  int input_w_local;
  void *input_data_local;
  void *alloc_context_local;
  
  info.ring_buffer_size = (int)t1;
  info.encode_buffer_size = (int)s1;
  stbir__setup((stbir__info *)local_178,input_w,input_h,output_w,output_h,channels);
  stbir__calculate_transform
            ((stbir__info *)local_178,s0,t0,(float)info.encode_buffer_size,
             (float)info.ring_buffer_size,transform);
  stbir__choose_filter((stbir__info *)local_178,h_filter,v_filter);
  sVar1 = stbir__calculate_memory((stbir__info *)local_178);
  tempmem = malloc((ulong)sVar1);
  if (tempmem == (void *)0x0) {
    alloc_context_local._4_4_ = 0;
  }
  else {
    alloc_context_local._4_4_ =
         stbir__resize_allocated
                   ((stbir__info *)local_178,input_data,input_stride_in_bytes,output_data,
                    output_stride_in_bytes,alpha_channel,flags,type,edge_horizontal,edge_vertical,
                    colorspace,tempmem,(ulong)sVar1);
    free(tempmem);
  }
  return alloc_context_local._4_4_;
}

Assistant:

static int stbir__resize_arbitrary(
    void *alloc_context,
    const void* input_data, int input_w, int input_h, int input_stride_in_bytes,
    void* output_data, int output_w, int output_h, int output_stride_in_bytes,
    float s0, float t0, float s1, float t1, float *transform,
    int channels, int alpha_channel, stbir_uint32 flags, stbir_datatype type,
    stbir_filter h_filter, stbir_filter v_filter,
    stbir_edge edge_horizontal, stbir_edge edge_vertical, stbir_colorspace colorspace)
{
    stbir__info info;
    int result;
    size_t memory_required;
    void* extra_memory;

    stbir__setup(&info, input_w, input_h, output_w, output_h, channels);
    stbir__calculate_transform(&info, s0,t0,s1,t1,transform);
    stbir__choose_filter(&info, h_filter, v_filter);
    memory_required = stbir__calculate_memory(&info);
    extra_memory = STBIR_MALLOC(memory_required, alloc_context);

    if (!extra_memory)
        return 0;

    result = stbir__resize_allocated(&info, input_data, input_stride_in_bytes,
                                            output_data, output_stride_in_bytes,
                                            alpha_channel, flags, type,
                                            edge_horizontal, edge_vertical,
                                            colorspace, extra_memory, memory_required);

    STBIR_FREE(extra_memory, alloc_context);

    return result;
}